

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O2

void __thiscall
cbtGImpactMeshShapePart::TrimeshPrimitiveManager::lock(TrimeshPrimitiveManager *this)

{
  int iVar1;
  
  if (this->m_lock_count < 1) {
    (*this->m_meshInterface->_vptr_cbtStridingMeshInterface[4])
              (this->m_meshInterface,&this->vertexbase,&this->numverts,&this->type,&this->stride,
               &this->indexbase,&this->indexstride,&this->numfaces,&this->indicestype,
               (ulong)(uint)this->m_part);
    iVar1 = 1;
  }
  else {
    iVar1 = this->m_lock_count + 1;
  }
  this->m_lock_count = iVar1;
  return;
}

Assistant:

void lock()
		{
			if (m_lock_count > 0)
			{
				m_lock_count++;
				return;
			}
			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase, numverts,
				type, stride, &indexbase, indexstride, numfaces, indicestype, m_part);

			m_lock_count = 1;
		}